

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O2

int decode_profile_tier_level(GetBitContext *gb,PTLCommon *ptl)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint32_t index;
  uint uVar3;
  uint32_t re_size_plus8;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *__ptr;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  size_t sStack_20;
  
  uVar9 = gb->index;
  if ((int)(gb->size_in_bits - uVar9) < 0x58) {
    return -1;
  }
  puVar2 = gb->buffer;
  uVar4 = *(uint *)(puVar2 + (uVar9 >> 3));
  uVar3 = gb->size_in_bits_plus8;
  uVar5 = uVar9 + 2;
  uVar6 = uVar5;
  if (uVar3 < uVar5) {
    uVar6 = uVar3;
  }
  gb->index = uVar6;
  uVar5 = uVar6 + (uVar5 < uVar3);
  ptl->profile_space =
       (byte)(((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) <<
              ((byte)uVar9 & 7)) >> 0x1e);
  uVar1 = puVar2[uVar6 >> 3];
  gb->index = uVar5;
  ptl->tier_flag = (byte)(uVar1 << ((byte)uVar6 & 7)) >> 7;
  uVar9 = *(uint *)(puVar2 + (uVar5 >> 3));
  uVar4 = (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) <<
          ((byte)uVar5 & 7);
  uVar9 = uVar5 + 5;
  if (uVar3 < uVar5 + 5) {
    uVar9 = uVar3;
  }
  gb->index = uVar9;
  ptl->profile_idc = (byte)(uVar4 >> 0x1b);
  switch(uVar4 >> 0x1b) {
  case 1:
    __ptr = "Main profile bitstream\n";
    sStack_20 = 0x17;
    break;
  case 2:
    __ptr = "Main 10 profile bitstream\n";
    sStack_20 = 0x1a;
    break;
  case 3:
    __ptr = "Main Still Picture profile bitstream\n";
    sStack_20 = 0x25;
    break;
  case 4:
    __ptr = "Range Extension profile bitstream\n";
    sStack_20 = 0x22;
    break;
  default:
    fprintf(_stderr,"Unknown HEVC profile: %d\n");
    goto LAB_00105693;
  }
  fwrite(__ptr,sStack_20,1,_stderr);
LAB_00105693:
  uVar8 = (ulong)ptl->profile_idc;
  uVar7 = 0;
  while( true ) {
    uVar9 = gb->index;
    puVar2 = gb->buffer;
    uVar4 = gb->size_in_bits_plus8;
    uVar3 = uVar9 + (uVar9 < uVar4);
    uVar9 = (uint)puVar2[uVar9 >> 3] << ((byte)uVar9 & 7);
    if (uVar7 == 0x20) break;
    gb->index = uVar3;
    uVar9 = uVar9 >> 7 & 1;
    ptl->profile_compatibility_flag[uVar7] = (uint8_t)uVar9;
    if (((uVar7 != 0) && ((char)uVar8 == '\0')) && (uVar9 != 0)) {
      ptl->profile_idc = (uint8_t)uVar7;
      uVar8 = uVar7 & 0xffffffff;
    }
    uVar7 = uVar7 + 1;
  }
  gb->index = uVar3;
  ptl->progressive_source_flag = (byte)uVar9 >> 7;
  uVar6 = uVar3 + (uVar3 < uVar4);
  uVar1 = puVar2[uVar3 >> 3];
  gb->index = uVar6;
  ptl->interlaced_source_flag = (byte)(uVar1 << ((byte)uVar3 & 7)) >> 7;
  uVar1 = puVar2[uVar6 >> 3];
  uVar9 = uVar6 + (uVar6 < uVar4);
  gb->index = uVar9;
  ptl->non_packed_constraint_flag = (byte)(uVar1 << ((byte)uVar6 & 7)) >> 7;
  ptl->frame_only_constraint_flag = (byte)(puVar2[uVar9 >> 3] << ((byte)uVar9 & 7)) >> 7;
  uVar9 = uVar6 + (uVar6 < uVar4) + (uint)(uVar9 < uVar4) + 0x10;
  if (uVar4 < uVar9) {
    uVar9 = uVar4;
  }
  uVar3 = uVar9 + 0x10;
  if (uVar4 < uVar9 + 0x10) {
    uVar3 = uVar4;
  }
  uVar9 = uVar3 + 0xc;
  if (uVar4 < uVar3 + 0xc) {
    uVar9 = uVar4;
  }
  gb->index = uVar9;
  return 0;
}

Assistant:

static int decode_profile_tier_level(GetBitContext *gb, PTLCommon *ptl)
{
    int i;

    if (get_bits_left(gb) < 2 + 1 + 5 + 32 + 4 + 16 + 16 + 12)
        return -1;
    ptl->profile_space = (uint8_t)get_bits(gb, 2);
    ptl->tier_flag     = (uint8_t)get_bits1(gb);
    ptl->profile_idc   = (uint8_t)get_bits(gb, 5);
    if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN)
        fprintf(stderr, "Main profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_10)
        fprintf(stderr, "Main 10 profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_MAIN_STILL_PICTURE)
        fprintf(stderr, "Main Still Picture profile bitstream\n");
    else if (ptl->profile_idc == FF_PROFILE_HEVC_REXT)
        fprintf(stderr, "Range Extension profile bitstream\n");
    else
        fprintf(stderr, "Unknown HEVC profile: %d\n", ptl->profile_idc);

    for (i = 0; i < 32; i++) {
        ptl->profile_compatibility_flag[i] = (uint8_t)get_bits1(gb);

        if (ptl->profile_idc == 0 && i > 0 && ptl->profile_compatibility_flag[i])
            ptl->profile_idc = (uint8_t)i;
    }
    ptl->progressive_source_flag    = (uint8_t)get_bits1(gb);
    ptl->interlaced_source_flag     = (uint8_t)get_bits1(gb);
    ptl->non_packed_constraint_flag = (uint8_t)get_bits1(gb);
    ptl->frame_only_constraint_flag = (uint8_t)get_bits1(gb);

    skip_bits(gb, 16); // XXX_reserved_zero_44bits[0..15]
    skip_bits(gb, 16); // XXX_reserved_zero_44bits[16..31]
    skip_bits(gb, 12); // XXX_reserved_zero_44bits[32..43]

    return 0;
}